

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

int __thiscall cashew::JSPrinter::getPrecedence(JSPrinter *this,Ref node,bool parent)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  Ref *pRVar4;
  IString *pIVar5;
  char *pcVar6;
  Type type_00;
  IString op;
  IString op_00;
  OperatorClass *pOStack_30;
  Ref local_20;
  Ref node_local;
  Ref type;
  char *pcVar7;
  
  uVar1 = (node.inst)->type - Assign_;
  pcVar6 = (char *)(ulong)uVar1;
  local_20.inst = node.inst;
  if (uVar1 < 2) {
    op.str._M_str._0_4_ = uVar1;
    op.str._M_len = DAT_01175560;
    op.str._M_str._4_4_ = 0;
    iVar3 = OperatorClass::getPrecedence((OperatorClass *)0x0,(Type)SET,op);
    return iVar3;
  }
  if ((node.inst)->type != Array) {
    return -1;
  }
  pRVar4 = Ref::operator[](&local_20,0);
  node_local.inst = pRVar4->inst;
  bVar2 = Ref::operator==(&node_local,(IString *)BINARY);
  if ((bVar2) || (bVar2 = Ref::operator==(&node_local,(IString *)UNARY_PREFIX), bVar2)) {
    bVar2 = Ref::operator==(&node_local,(IString *)BINARY);
    pRVar4 = Ref::operator[](&local_20,1);
    pIVar5 = cashew::Value::getIString(pRVar4->inst);
    type_00 = (Type)(pIVar5->str)._M_len;
    pOStack_30 = (OperatorClass *)(ulong)!bVar2;
    pcVar7 = (pIVar5->str)._M_str;
  }
  else {
    bVar2 = Ref::operator==(&node_local,(IString *)SEQ);
    if (!bVar2) {
      bVar2 = Ref::operator==(&node_local,(IString *)CALL);
      if (!bVar2) {
        bVar2 = Ref::operator==(&node_local,(IString *)CONDITIONAL);
        if (!bVar2) {
          return -1;
        }
        type_00 = (Type)QUESTION;
        pOStack_30 = (OperatorClass *)0x3;
        pcVar7 = DAT_011754c0;
        goto LAB_00d44e7c;
      }
      if (!parent) {
        return -1;
      }
    }
    type_00 = (Type)COMMA;
    pOStack_30 = (OperatorClass *)0x0;
    pcVar7 = DAT_011754b0;
  }
LAB_00d44e7c:
  op_00.str._M_str = pcVar6;
  op_00.str._M_len = (size_t)pcVar7;
  iVar3 = OperatorClass::getPrecedence(pOStack_30,type_00,op_00);
  return iVar3;
}

Assistant:

int getPrecedence(Ref node, bool parent) {
    if (node->isAssign() || node->isAssignName()) {
      return OperatorClass::getPrecedence(OperatorClass::Binary, SET);
    }
    if (!node->isArray()) {
      // node is a value
      return -1;
    }
    Ref type = node[0];
    if (type == BINARY || type == UNARY_PREFIX) {
      return OperatorClass::getPrecedence(
        type == BINARY ? OperatorClass::Binary : OperatorClass::Prefix,
        node[1]->getIString());
    } else if (type == SEQ) {
      return OperatorClass::getPrecedence(OperatorClass::Binary, COMMA);
    } else if (type == CALL) {
      // call arguments are split by commas, but call itself is safe
      return parent ? OperatorClass::getPrecedence(OperatorClass::Binary, COMMA)
                    : -1;
    } else if (type == CONDITIONAL) {
      return OperatorClass::getPrecedence(OperatorClass::Tertiary, QUESTION);
    }
    // otherwise, this is something that fixes precedence explicitly, and we can
    // ignore
    return -1; // XXX
  }